

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::GetApproximateQuantileAggregateFunction(LogicalType *type)

{
  byte bVar1;
  PhysicalType PVar2;
  InternalException *this;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  allocator local_1d9;
  string local_1d8 [24];
  LogicalType *in_stack_fffffffffffffe40;
  LogicalType *in_stack_fffffffffffffe48;
  LogicalType local_1a0 [24];
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  LogicalType local_158 [24];
  LogicalType local_140 [24];
  LogicalType local_128 [24];
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  LogicalType local_b0 [24];
  LogicalType local_98 [24];
  LogicalType local_80 [24];
  LogicalType local_68 [24];
  LogicalType local_50 [40];
  LogicalType local_28 [24];
  LogicalType *local_10;
  
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_28,TIME_TZ);
  bVar1 = duckdb::LogicalType::operator==(in_RSI,local_28);
  duckdb::LogicalType::~LogicalType(local_28);
  if ((bVar1 & 1) == 0) {
    PVar2 = LogicalType::InternalType(local_10);
    switch(PVar2) {
    case INT8:
      duckdb::LogicalType::LogicalType(local_80,local_10);
      duckdb::LogicalType::LogicalType(local_98,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,signed_char,signed_char,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_98);
      duckdb::LogicalType::~LogicalType(local_80);
      break;
    case INT16:
      duckdb::LogicalType::LogicalType(local_b0,local_10);
      duckdb::LogicalType::LogicalType(local_c8,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,short,short,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_c8);
      duckdb::LogicalType::~LogicalType(local_b0);
      break;
    case INT32:
      duckdb::LogicalType::LogicalType(local_e0,local_10);
      duckdb::LogicalType::LogicalType(local_f8,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,int,int,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_f8);
      duckdb::LogicalType::~LogicalType(local_e0);
      break;
    case INT64:
      duckdb::LogicalType::LogicalType(local_110,local_10);
      duckdb::LogicalType::LogicalType(local_128,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,long,long,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_128);
      duckdb::LogicalType::~LogicalType(local_110);
      break;
    case FLOAT:
      duckdb::LogicalType::LogicalType(local_170,local_10);
      duckdb::LogicalType::LogicalType(local_188,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,float,float,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_188);
      duckdb::LogicalType::~LogicalType(local_170);
      break;
    case DOUBLE:
      duckdb::LogicalType::LogicalType(local_1a0,local_10);
      duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffe48,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,double,double,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffe48);
      duckdb::LogicalType::~LogicalType(local_1a0);
      break;
    case INT128:
      duckdb::LogicalType::LogicalType(local_140,local_10);
      duckdb::LogicalType::LogicalType(local_158,local_10);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      duckdb::LogicalType::~LogicalType(local_158);
      duckdb::LogicalType::~LogicalType(local_140);
      break;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Unimplemented quantile aggregate",&local_1d9);
      duckdb::InternalException::InternalException(this,local_1d8);
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
  }
  else {
    duckdb::LogicalType::LogicalType(local_50,local_10);
    duckdb::LogicalType::LogicalType(local_68,local_10);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    duckdb::LogicalType::~LogicalType(local_68);
    duckdb::LogicalType::~LogicalType(local_50);
  }
  return in_RDI;
}

Assistant:

static AggregateFunction GetApproximateQuantileAggregateFunction(const LogicalType &type) {
	//	Not binary comparable
	if (type == LogicalType::TIME_TZ) {
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, dtime_tz_t, dtime_tz_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	}
	switch (type.InternalType()) {
	case PhysicalType::INT8:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int8_t, int8_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT16:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int16_t, int16_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT32:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int32_t, int32_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT64:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int64_t, int64_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT128:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, hugeint_t, hugeint_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::FLOAT:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, float, float,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::DOUBLE:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, double, double,
		                                                   ApproxQuantileScalarOperation>(type, type);
	default:
		throw InternalException("Unimplemented quantile aggregate");
	}
}